

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool __thiscall ghc::filesystem::path::has_stem(path *this)

{
  string local_30 [8];
  long local_28;
  
  stem((path *)local_30,this);
  std::__cxx11::string::~string(local_30);
  return local_28 != 0;
}

Assistant:

GHC_INLINE bool path::has_stem() const
{
    return !stem().empty();
}